

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::BlockMultiNestedStructCase::init
          (BlockMultiNestedStructCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_> *pvVar1;
  ShaderInterface *this_00;
  int iVar2;
  StructType *this_01;
  StructType *this_02;
  UniformBlock *pUVar3;
  UniformBlock *pUVar4;
  VarType local_90;
  Uniform local_78;
  BlockMultiNestedStructCase *local_38;
  
  this_00 = &(this->super_UniformBlockCase).m_interface;
  local_38 = this;
  this_01 = deqp::gls::ub::ShaderInterface::allocStruct(this_00,"S");
  deqp::gls::ub::VarType::VarType((VarType *)&local_78,TYPE_FLOAT_MAT3,1);
  deqp::gls::ub::StructType::addMember(this_01,"a",(VarType *)&local_78,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_78);
  deqp::gls::ub::VarType::VarType(&local_90,TYPE_INT_VEC2,2);
  deqp::gls::ub::VarType::VarType((VarType *)&local_78,&local_90,4);
  deqp::gls::ub::StructType::addMember(this_01,"b",(VarType *)&local_78,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_78);
  deqp::gls::ub::VarType::~VarType(&local_90);
  deqp::gls::ub::VarType::VarType((VarType *)&local_78,TYPE_FLOAT_VEC4,4);
  deqp::gls::ub::StructType::addMember(this_01,"c",(VarType *)&local_78,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_78);
  this_02 = deqp::gls::ub::ShaderInterface::allocStruct(this_00,"T");
  deqp::gls::ub::VarType::VarType((VarType *)&local_78,TYPE_UINT,2);
  deqp::gls::ub::StructType::addMember(this_02,"a",(VarType *)&local_78,0xc00);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_78);
  deqp::gls::ub::VarType::VarType((VarType *)&local_78,this_01);
  deqp::gls::ub::StructType::addMember(this_02,"b",(VarType *)&local_78,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_78);
  deqp::gls::ub::VarType::VarType((VarType *)&local_78,TYPE_BOOL_VEC4,0);
  deqp::gls::ub::StructType::addMember(this_02,"c",(VarType *)&local_78,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_78);
  pUVar3 = deqp::gls::ub::ShaderInterface::allocBlock(this_00,"BlockA");
  deqp::gls::ub::VarType::VarType(&local_90,TYPE_FLOAT,4);
  deqp::gls::ub::Uniform::Uniform(&local_78,"a",&local_90,0);
  pvVar1 = &pUVar3->m_uniforms;
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (pvVar1,&local_78);
  deqp::gls::ub::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::ub::VarType::~VarType(&local_90);
  deqp::gls::ub::VarType::VarType(&local_90,this_01);
  deqp::gls::ub::Uniform::Uniform(&local_78,"b",&local_90,0);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (pvVar1,&local_78);
  deqp::gls::ub::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::ub::VarType::~VarType(&local_90);
  deqp::gls::ub::VarType::VarType(&local_90,TYPE_UINT_VEC3,1);
  deqp::gls::ub::Uniform::Uniform(&local_78,"c",&local_90,0xc00);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (pvVar1,&local_78);
  deqp::gls::ub::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::ub::VarType::~VarType(&local_90);
  std::__cxx11::string::_M_replace
            ((ulong)&pUVar3->m_instanceName,0,(char *)(pUVar3->m_instanceName)._M_string_length,
             0x1bd18f8);
  pUVar3->m_flags = local_38->m_flagsA;
  pUVar4 = deqp::gls::ub::ShaderInterface::allocBlock(this_00,"BlockB");
  deqp::gls::ub::VarType::VarType(&local_90,TYPE_FLOAT_MAT2,2);
  deqp::gls::ub::Uniform::Uniform(&local_78,"a",&local_90,0);
  pvVar1 = &pUVar4->m_uniforms;
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (pvVar1,&local_78);
  deqp::gls::ub::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::ub::VarType::~VarType(&local_90);
  deqp::gls::ub::VarType::VarType(&local_90,this_02);
  deqp::gls::ub::Uniform::Uniform(&local_78,"b",&local_90,0);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (pvVar1,&local_78);
  deqp::gls::ub::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::ub::VarType::~VarType(&local_90);
  deqp::gls::ub::VarType::VarType(&local_90,TYPE_BOOL_VEC4,0);
  deqp::gls::ub::Uniform::Uniform(&local_78,"c",&local_90,0xc00);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (pvVar1,&local_78);
  deqp::gls::ub::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::ub::VarType::~VarType(&local_90);
  deqp::gls::ub::VarType::VarType(&local_90,TYPE_BOOL,0);
  deqp::gls::ub::Uniform::Uniform(&local_78,"d",&local_90,0);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (pvVar1,&local_78);
  deqp::gls::ub::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::ub::VarType::~VarType(&local_90);
  std::__cxx11::string::_M_replace
            ((ulong)&pUVar4->m_instanceName,0,(char *)(pUVar4->m_instanceName)._M_string_length,
             0x1bd1906);
  pUVar4->m_flags = local_38->m_flagsB;
  iVar2 = local_38->m_numInstances;
  if (0 < iVar2) {
    pUVar3->m_arraySize = iVar2;
    pUVar4->m_arraySize = iVar2;
  }
  return iVar2;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, PRECISION_LOW));
		typeS.addMember("b", VarType(VarType(glu::TYPE_INT_VEC2, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH));

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_UINT, PRECISION_MEDIUM), UNUSED_BOTH);
		typeT.addMember("b", VarType(&typeS));
		typeT.addMember("c", VarType(glu::TYPE_BOOL_VEC4, 0));

		UniformBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT, PRECISION_HIGH)));
		blockA.addUniform(Uniform("b", VarType(&typeS)));
		blockA.addUniform(Uniform("c", VarType(glu::TYPE_UINT_VEC3, PRECISION_LOW), UNUSED_BOTH));
		blockA.setInstanceName("blockA");
		blockA.setFlags(m_flagsA);

		UniformBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addUniform(Uniform("a", VarType(glu::TYPE_FLOAT_MAT2, PRECISION_MEDIUM)));
		blockB.addUniform(Uniform("b", VarType(&typeT)));
		blockB.addUniform(Uniform("c", VarType(glu::TYPE_BOOL_VEC4, 0), UNUSED_BOTH));
		blockB.addUniform(Uniform("d", VarType(glu::TYPE_BOOL, 0)));
		blockB.setInstanceName("blockB");
		blockB.setFlags(m_flagsB);

		if (m_numInstances > 0)
		{
			blockA.setArraySize(m_numInstances);
			blockB.setArraySize(m_numInstances);
		}
	}